

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  N_Vector x;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *module;
  char *module_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *module_01;
  char *module_02;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *module_03;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *module_04;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *module_05;
  char *extraout_RDX_15;
  char *module_06;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *module_07;
  char *extraout_RDX_23;
  char *module_08;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *module_09;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *pcVar9;
  char *extraout_RDX_29;
  char *module_10;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *module_11;
  char *module_12;
  N_Vector p_Var10;
  N_Vector p_Var11;
  int iVar12;
  KINMem pKVar13;
  char *pcVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  sunrealtype sVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_d8;
  double local_c8;
  double local_a8;
  double local_98;
  double local_80;
  
  if (kinmem == (void *)0x0) {
    pcVar14 = "kinsol_mem = NULL illegal.";
    iVar4 = -1;
    kinmem = (KINMem)0x0;
    iVar12 = -1;
    iVar6 = 0x1f0;
  }
  else if (*(int *)((long)kinmem + 0x298) == 0) {
    pcVar14 = "Attempt to call before KINMalloc illegal.";
    iVar4 = -3;
    iVar12 = -3;
    iVar6 = 0x1f9;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar14 = "uu = NULL illegal.";
        iVar4 = -2;
        iVar12 = -2;
        iVar6 = 0x20d;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg  fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        p_Var10 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        do {
          *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
          pKVar13 = *(KINMem *)((long)kinmem + 0x108);
          iVar4 = (**(code **)((long)kinmem + 0x10))
                            (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          if (iVar4 < 0) {
            pcVar14 = extraout_RDX_00;
            p_Var10 = (N_Vector)0xfffffff3;
            goto LAB_0010a206;
          }
          if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_0010a07a:
            if (*(int *)((long)kinmem + 0x164) == 0) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar21 = 1.0;
            }
            else {
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
LAB_0010a0b9:
              dVar21 = *(double *)((long)kinmem + 0x168);
            }
          }
          else {
            lVar8 = *(long *)((long)kinmem + 0xd0);
            uVar15 = *(ulong *)((long)kinmem + 0x1c8);
            if (lVar8 <= (long)uVar15) goto LAB_0010a07a;
            if ((long)uVar15 < 1) {
              uVar15 = 0;
            }
            u_scale = *(N_Vector *)((long)kinmem + 0x110);
            AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var10,u_scale,
                        *(N_Vector *)((long)kinmem + 0x108),lVar8 + ~uVar15,
                        *(sunrealtype **)((long)kinmem + 0x1a8),
                        *(sunrealtype **)((long)kinmem + 0x1a0));
            dVar21 = 1.0;
            if ((~uVar15 + lVar8 == 0) && (dVar21 = 1.0, *(int *)((long)kinmem + 0x1e8) != 0))
            goto LAB_0010a0b9;
          }
          N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                       *(undefined8 *)((long)kinmem + 0x108),p_Var10);
          N_VProd(*(undefined8 *)((long)kinmem + 0x130),p_Var10,
                  *(undefined8 *)((long)kinmem + 0x148));
          pKVar13 = *(KINMem *)((long)kinmem + 0x148);
          uVar18 = N_VMaxNorm();
          *(undefined8 *)((long)kinmem + 0x250) = uVar18;
          KINPrintInfo(pKVar13,4,module,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg");
          KINPrintInfo(pKVar13,2,module_00,(char *)u_scale,
                       "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          lVar8 = *(long *)((long)kinmem + 0x38);
          lVar1 = *(long *)((long)kinmem + 0xd0);
          dVar23 = *(double *)((long)kinmem + 0x250);
          dVar21 = dVar21 * *(double *)((long)kinmem + 0x20);
          bVar17 = dVar21 < dVar23 && lVar1 < lVar8;
          if ((bVar17) || (pcVar14 = extraout_RDX_01, *(int *)((long)kinmem + 0x160) != 0)) {
            pKVar13 = *(KINMem *)((long)kinmem + 0x110);
            N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
            pcVar14 = extraout_RDX_02;
          }
        } while (bVar17);
        u_scale = (N_Vector)0xfffffffa;
        if (lVar1 < lVar8) {
          u_scale = (N_Vector)0xfffffc19;
        }
        p_Var10 = (N_Vector)0x0;
        if (dVar21 < dVar23) {
          p_Var10 = u_scale;
        }
LAB_0010a206:
        iVar4 = (int)p_Var10;
        KINPrintInfo(pKVar13,1,pcVar14,(char *)u_scale,"Return value: %d",p_Var10);
        if (iVar4 == -6) {
          pcVar14 = "The maximum number of iterations was reached before convergence.";
          iVar12 = -6;
          iVar6 = 0x22b;
        }
        else {
          if (iVar4 != -0xd) {
            return iVar4;
          }
          pcVar14 = "The system function failed in an unrecoverable manner.";
          iVar12 = -0xd;
          iVar6 = 0x227;
        }
      }
      else {
        pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
        iVar4 = -2;
        iVar12 = -2;
        iVar6 = 0x215;
      }
    }
    else {
      if (u == (N_Vector)0x0) {
        pcVar14 = "uu = NULL illegal.";
        iVar6 = -2;
        iVar12 = -2;
        iVar4 = 0x59d;
LAB_0010a32d:
        bVar17 = false;
        KINProcessError((KINMem)kinmem,iVar12,iVar4,"KINSolInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                        ,pcVar14);
      }
      else {
        if (3 < (uint)strategy_in) {
          pcVar14 = "Illegal value for global strategy.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5a9;
          goto LAB_0010a32d;
        }
        if (u_scale == (N_Vector)0x0) {
          pcVar14 = "uscale = NULL illegal.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5b0;
          goto LAB_0010a32d;
        }
        dVar21 = (double)N_VMin(u_scale);
        if (dVar21 <= 0.0) {
          pcVar14 = "uscale has nonpositive elements.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5b7;
          goto LAB_0010a32d;
        }
        if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar14 = "fscale = NULL illegal.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5be;
          goto LAB_0010a32d;
        }
        dVar21 = (double)N_VMin();
        if (dVar21 <= 0.0) {
          pcVar14 = "fscale has nonpositive elements.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5c5;
          goto LAB_0010a32d;
        }
        pKVar13 = *(KINMem *)((long)kinmem + 0x140);
        if (pKVar13 != (KINMem)0x0) {
          if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
            pcVar14 = "Constraints not allowed with fixed point or Picard iterations";
            iVar6 = -2;
            iVar12 = -2;
            iVar4 = 0x5ce;
          }
          else {
            *(undefined4 *)((long)kinmem + 0x60) = 1;
            if ((*(long *)((long)pKVar13->kin_uround + 0xe0) != 0) &&
               (*(long *)((long)pKVar13->kin_uround + 0xe8) != 0)) goto LAB_0010bbe9;
            pcVar14 = "A required vector operation is not implemented.";
            iVar6 = -2;
            iVar12 = -2;
            iVar4 = 0x5df;
          }
          goto LAB_0010a32d;
        }
        *(undefined4 *)((long)kinmem + 0x60) = 0;
LAB_0010bbe9:
        pcVar14 = extraout_RDX;
        if ((*(int *)((long)kinmem + 0x60) != 0) &&
           (iVar4 = N_VConstrMask(pKVar13,*(undefined8 *)((long)kinmem + 0x108),
                                  *(undefined8 *)((long)kinmem + 0x148)), pcVar14 = extraout_RDX_31,
           iVar4 == 0)) {
          pcVar14 = "Initial guess does NOT meet constraints.";
          iVar6 = -2;
          iVar12 = -2;
          iVar4 = 0x5ec;
          goto LAB_0010a32d;
        }
        KINPrintInfo(pKVar13,3,pcVar14,(char *)u_scale,"scsteptol = %12.3lg  fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28));
        dVar21 = *(double *)((long)kinmem + 0x80);
        if ((dVar21 == 0.0) && (!NAN(dVar21))) {
          dVar21 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x128));
          dVar21 = dVar21 * 1000.0;
        }
        *(double *)((long)kinmem + 0x78) = dVar21;
        if (dVar21 < 1.0) {
          *(undefined8 *)((long)kinmem + 0x78) = 0x3ff0000000000000;
        }
        if (*(int *)((long)kinmem + 0x240) == 0) {
          *(undefined4 *)((long)kinmem + 0x68) = 0;
        }
        else {
          bVar17 = *(int *)((long)kinmem + 0x58) != 3;
          u_scale = (N_Vector)(ulong)bVar17;
          *(uint *)((long)kinmem + 0x68) = (uint)bVar17;
          if (bVar17) {
            if (*(int *)((long)kinmem + 0x58) == 1) {
              *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
            }
            *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
          }
          *(undefined4 *)((long)kinmem + 0x6c) = 1;
        }
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        iVar4 = (**(code **)((long)kinmem + 0x10))
                          (*(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        if (iVar4 < 0) {
          pcVar14 = "The system function failed in an unrecoverable manner.";
          iVar6 = -0xd;
          iVar12 = -0xd;
          iVar4 = 0x629;
          goto LAB_0010a32d;
        }
        if (iVar4 != 0) {
          pcVar14 = "The system function failed at the first call.";
          iVar6 = -0xe;
          iVar12 = -0xe;
          iVar4 = 0x62f;
          goto LAB_0010a32d;
        }
        pKVar13 = (KINMem)kinmem;
        sVar19 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                            *(N_Vector *)((long)kinmem + 0x130));
        if (sVar19 <= *(double *)((long)kinmem + 0x20) * 0.01) {
          uVar18 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                              *(undefined8 *)((long)kinmem + 0x130));
          *(undefined8 *)((long)kinmem + 0x250) = uVar18;
          iVar6 = 1;
          bVar17 = false;
        }
        else {
          bVar17 = true;
          KINPrintInfo(pKVar13,4,module_11,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg")
          ;
          if ((*(code **)((long)kinmem + 0x220) != (code *)0x0) &&
             (iVar4 = (**(code **)((long)kinmem + 0x220))(kinmem), iVar4 != 0)) {
            pcVar14 = "The linear solver\'s init routine failed.";
            iVar6 = -10;
            iVar12 = -10;
            iVar4 = 0x646;
            goto LAB_0010a32d;
          }
          pKVar13 = *(KINMem *)((long)kinmem + 0x118);
          dVar21 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
          *(double *)((long)kinmem + 0x250) = dVar21;
          *(double *)((long)kinmem + 600) = dVar21 * 0.5 * dVar21;
          *(double *)((long)kinmem + 0x270) = dVar21;
          KINPrintInfo(pKVar13,2,module_12,(char *)u_scale,
                       "nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0xd0),*(undefined8 *)((long)kinmem + 0xd8));
          iVar6 = 0;
        }
      }
      if (!bVar17) {
        return iVar6;
      }
      *(undefined8 *)((long)kinmem + 0x100) = 0;
      pcVar14 = "";
      *(undefined8 *)((long)kinmem + 200) =
           *(undefined8 *)(&DAT_0011b0d0 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
      local_80 = 0.0;
      if ((*(int *)((long)kinmem + 0x240) != 0) &&
         (local_80 = 0.0, *(int *)((long)kinmem + 0x5c) == 0)) {
        local_80 = *(double *)((long)kinmem + 0x20) * 0.01;
      }
      *(uint *)((long)kinmem + 0x278) = -(uint)(*(double *)((long)kinmem + 0x280) == 0.0) & 1;
      if (*(int *)((long)kinmem + 0x30) != 2) {
        bVar17 = false;
        local_f0 = -1.0;
        local_f8 = -1.0;
        uVar5 = 0;
LAB_0010a7dd:
        *(undefined4 *)((long)kinmem + 0x70) = 0;
        *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
        if (*(int *)((long)kinmem + 0x240) != 0) {
          dVar21 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                   *(double *)((long)kinmem + 0x250);
          *(double *)((long)kinmem + 0xa0) = dVar21;
          if (*(int *)((long)kinmem + 0x5c) == 0) {
            dVar23 = local_80;
            if (local_80 <= dVar21) {
              dVar23 = dVar21;
            }
            *(double *)((long)kinmem + 0xa0) = dVar23;
          }
        }
LAB_0010a834:
        pKVar13 = (KINMem)kinmem;
        if (*(int *)((long)kinmem + 0x30) == 1) {
          uVar5 = KINLinSolDrv((KINMem)kinmem);
          pcVar9 = extraout_RDX_12;
          if (uVar5 == 0) {
            local_100 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x138),
                                           *(undefined8 *)((long)kinmem + 0x128));
            dVar21 = *(double *)((long)kinmem + 0x78) / local_100;
            *(double *)((long)kinmem + 0x90) = local_100;
            if (local_100 <= *(double *)((long)kinmem + 0x78)) {
              local_d8 = 1.0;
              local_98 = dVar21;
            }
            else {
              N_VScale(dVar21,*(undefined8 *)((long)kinmem + 0x138),
                       *(undefined8 *)((long)kinmem + 0x138));
              local_100 = *(double *)((long)kinmem + 0x78);
              *(double *)((long)kinmem + 0x90) = local_100;
              local_98 = 1.0;
              local_d8 = dVar21;
            }
            *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
            if ((*(int *)((long)kinmem + 0x60) == 0) ||
               (iVar4 = KINConstraint((KINMem)kinmem), iVar4 != -0x3e4)) {
LAB_0010ab7f:
              iVar4 = 5;
              do {
                N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                             *(undefined8 *)((long)kinmem + 0x108),
                             *(undefined8 *)((long)kinmem + 0x138),
                             *(undefined8 *)((long)kinmem + 0x110));
                pKVar13 = *(KINMem *)((long)kinmem + 0x110);
                iVar6 = (**(code **)((long)kinmem + 0x10))
                                  (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                   *(undefined8 *)((long)kinmem + 0x18));
                *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                if (iVar6 == 0) {
                  local_f0 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                *(undefined8 *)((long)kinmem + 0x130));
                  dVar21 = *(double *)((long)kinmem + 0x260) * local_d8;
                  pKVar13 = (KINMem)kinmem;
                  sVar19 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                      *(N_Vector *)((long)kinmem + 0x108));
                  dVar24 = *(double *)((long)kinmem + 0x28) / sVar19;
                  KINPrintInfo(pKVar13,8,module_06,pcVar14,
                               "min_lam = %11.4le   f1norm = %11.4le   pnorm = %11.4le",dVar24,
                               *(undefined8 *)((long)kinmem + 600),local_100);
                  dVar23 = dVar21 * 0.0001;
                  iVar4 = 0;
                  uVar28 = 0;
                  uVar29 = 0;
                  bVar16 = false;
                  pcVar9 = extraout_RDX_16;
                  local_c8 = 0.0;
                  local_e8 = 1.0;
                  local_f8 = local_f0 * 0.5 * local_f0;
                  goto LAB_0010adac;
                }
                bVar17 = false;
                pcVar9 = extraout_RDX_13;
                if (iVar6 < 0) goto LAB_0010b0a2;
                pKVar13 = *(KINMem *)((long)kinmem + 0x138);
                N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
                local_d8 = local_d8 * 0.5;
                local_100 = local_100 * 0.5;
                *(double *)((long)kinmem + 0x90) = local_100;
                local_98 = 1.0;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
              uVar15 = 0xfffffff1;
              pcVar9 = extraout_RDX_14;
            }
            else {
              pKVar13 = *(KINMem *)((long)kinmem + 0x138);
              N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar13,pKVar13);
              dVar21 = *(double *)((long)kinmem + 0x98);
              local_100 = local_100 * dVar21;
              *(double *)((long)kinmem + 0x90) = local_100;
              KINPrintInfo(pKVar13,6,module_04,pcVar14,"(ivio=1) pnorm = %12.4le");
              if (*(double *)((long)kinmem + 0x28) < local_100) {
                local_d8 = local_d8 * dVar21;
                local_98 = 1.0;
                goto LAB_0010ab7f;
              }
              pKVar13 = *(KINMem *)((long)kinmem + 0x108);
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar13,
                           *(undefined8 *)((long)kinmem + 0x138),
                           *(undefined8 *)((long)kinmem + 0x110));
              uVar15 = 0xfffffc1b;
              bVar17 = false;
              pcVar9 = extraout_RDX_22;
            }
            goto LAB_0010b129;
          }
LAB_0010b9d3:
          uVar15 = (ulong)uVar5;
        }
        else {
          if (*(int *)((long)kinmem + 0x30) != 0) {
            uVar7 = 0;
            goto LAB_0010b165;
          }
          uVar5 = KINLinSolDrv((KINMem)kinmem);
          pcVar9 = extraout_RDX_07;
          if (uVar5 != 0) goto LAB_0010b9d3;
          pKVar13 = *(KINMem *)((long)kinmem + 0x138);
          local_100 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x128));
          local_d8 = 1.0;
          pcVar9 = extraout_RDX_08;
          if (*(double *)((long)kinmem + 0x78) < local_100) {
            local_d8 = *(double *)((long)kinmem + 0x78) / local_100;
            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
            N_VScale(local_d8,pKVar13,pKVar13);
            local_100 = *(double *)((long)kinmem + 0x78);
            pcVar9 = extraout_RDX_09;
          }
          KINPrintInfo(pKVar13,5,pcVar9,pcVar14,"pnorm = %12.4le",local_100);
          *(double *)((long)kinmem + 0x90) = local_100;
          *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
          if ((*(int *)((long)kinmem + 0x60) == 0) ||
             (iVar4 = KINConstraint((KINMem)kinmem), iVar4 != -0x3e4)) {
LAB_0010a96d:
            iVar4 = 5;
            do {
              N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x138),
                           *(undefined8 *)((long)kinmem + 0x110));
              pKVar13 = *(KINMem *)((long)kinmem + 0x110);
              iVar6 = (**(code **)((long)kinmem + 0x10))
                                (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar6 == 0) {
                pKVar13 = *(KINMem *)((long)kinmem + 0x118);
                local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
                local_f8 = local_f0 * 0.5 * local_f0;
                *(double *)((long)kinmem + 0x260) = local_d8 * *(double *)((long)kinmem + 0x260);
                *(double *)((long)kinmem + 0x268) = local_d8 * *(double *)((long)kinmem + 0x268);
                KINPrintInfo(pKVar13,7,module_05,pcVar14,"fnorm(L2) = %20.8le");
                uVar15 = 0;
                pcVar9 = extraout_RDX_15;
                if (local_100 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                  bVar17 = false;
                }
                else {
                  bVar17 = true;
                }
                goto LAB_0010b154;
              }
              bVar17 = false;
              if (iVar6 < 0) {
                uVar15 = 0xfffffff3;
                pcVar9 = extraout_RDX_10;
                goto LAB_0010b154;
              }
              local_d8 = local_d8 * 0.5;
              pKVar13 = *(KINMem *)((long)kinmem + 0x138);
              N_VScale(0x3fe0000000000000,pKVar13,pKVar13);
              local_100 = local_100 * 0.5;
              *(double *)((long)kinmem + 0x90) = local_100;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            uVar15 = 0xfffffff1;
            pcVar9 = extraout_RDX_11;
          }
          else {
            dVar21 = *(double *)((long)kinmem + 0x98);
            pKVar13 = *(KINMem *)((long)kinmem + 0x138);
            N_VScale(pKVar13,pKVar13);
            local_100 = local_100 * *(double *)((long)kinmem + 0x98);
            *(double *)((long)kinmem + 0x90) = local_100;
            KINPrintInfo(pKVar13,5,module_03,pcVar14,"pnorm = %12.4le");
            if (*(double *)((long)kinmem + 0x28) < local_100) {
              local_d8 = local_d8 * dVar21;
              goto LAB_0010a96d;
            }
            pKVar13 = *(KINMem *)((long)kinmem + 0x108);
            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar13,
                         *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110)
                        );
            uVar15 = 0xfffffc1b;
            bVar17 = false;
            pcVar9 = extraout_RDX_21;
          }
LAB_0010b154:
          uVar7 = (uint)uVar15;
          if ((uVar7 & 0xfffffff9) != 0xfffffff1) goto LAB_0010b162;
        }
        goto LAB_0010b9dc;
      }
      if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a40a:
        p_Var10 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 0;
        local_d8 = 0.0;
        if ((*(int *)((long)kinmem + 0x240) != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
          local_d8 = *(double *)((long)kinmem + 0x20) * 0.01;
        }
        do {
          lVar8 = *(long *)((long)kinmem + 0xd0) + 1;
          *(long *)((long)kinmem + 0xd0) = lVar8;
          if (*(int *)((long)kinmem + 0x240) != 0) {
            dVar21 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                     *(double *)((long)kinmem + 0x250);
            *(double *)((long)kinmem + 0xa0) = dVar21;
            if (*(int *)((long)kinmem + 0x5c) == 0) {
              dVar23 = local_d8;
              if (local_d8 <= dVar21) {
                dVar23 = dVar21;
              }
              *(double *)((long)kinmem + 0xa0) = dVar23;
            }
          }
          if (*(long *)((long)kinmem + 0x40) <= lVar8 - *(long *)((long)kinmem + 0xe0)) {
            *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
            *(undefined4 *)((long)kinmem + 0x74) = 1;
          }
          uVar18 = *(undefined8 *)((long)kinmem + 0x120);
          uVar2 = *(undefined8 *)((long)kinmem + 0x108);
          uVar3 = *(undefined8 *)((long)kinmem + 0x118);
          while( true ) {
            *(undefined4 *)((long)kinmem + 100) = 0;
            if ((1.5 < *(double *)((long)kinmem + 200)) &&
               (*(code **)((long)kinmem + 0x228) != (code *)0x0)) {
              pKVar13 = (KINMem)kinmem;
              iVar4 = (**(code **)((long)kinmem + 0x228))();
              *(undefined4 *)((long)kinmem + 100) = 1;
              x = *(N_Vector *)((long)kinmem + 0xd0);
              *(N_Vector *)((long)kinmem + 0xe0) = x;
              *(N_Vector *)((long)kinmem + 0xe8) = x;
              pcVar14 = extraout_RDX_03;
              if (iVar4 != 0) goto LAB_0010bb99;
            }
            N_VScale(0xbff0000000000000,uVar3,uVar3);
            x = (N_Vector)((long)kinmem + 0x268);
            pKVar13 = (KINMem)kinmem;
            iVar4 = (**(code **)((long)kinmem + 0x230))
                              (kinmem,uVar18,uVar3,(N_Vector)((long)kinmem + 0x268),
                               (long)kinmem + 0x260);
            if (iVar4 == 0) break;
            p_Var11 = (N_Vector)0xfffffff3;
            pcVar14 = extraout_RDX_04;
            if (((iVar4 < 0) || (*(long *)((long)kinmem + 0x228) == 0)) ||
               (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010bb9e;
            *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
          }
          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar2,uVar18,uVar18);
          if (*(long *)((long)kinmem + 0x1c0) == 0) {
LAB_0010a622:
            if (*(int *)((long)kinmem + 0x164) == 0) {
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                       *(undefined8 *)((long)kinmem + 0x110));
            }
            else {
              N_VLinearSum(1.0 - *(double *)((long)kinmem + 0x168),
                           *(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x120),
                           *(undefined8 *)((long)kinmem + 0x110));
            }
          }
          else {
            uVar15 = *(ulong *)((long)kinmem + 0x1c8);
            if (*(long *)((long)kinmem + 0xd0) <= (long)uVar15) goto LAB_0010a622;
            if ((long)uVar15 < 1) {
              uVar15 = 0;
            }
            x = *(N_Vector *)((long)kinmem + 0x110);
            AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),p_Var10,x,
                        *(N_Vector *)((long)kinmem + 0x108),*(long *)((long)kinmem + 0xd0) + ~uVar15
                        ,*(sunrealtype **)((long)kinmem + 0x1a8),
                        *(sunrealtype **)((long)kinmem + 0x1a0));
          }
          pKVar13 = *(KINMem *)((long)kinmem + 0x110);
          iVar4 = (**(code **)((long)kinmem + 0x10))
                            (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                             *(undefined8 *)((long)kinmem + 0x18));
          *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
          pcVar14 = extraout_RDX_05;
          if (iVar4 < 0) {
LAB_0010bb99:
            p_Var11 = (N_Vector)0xfffffff3;
            goto LAB_0010bb9e;
          }
          N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
                  *(undefined8 *)((long)kinmem + 0x148));
          pKVar13 = *(KINMem *)((long)kinmem + 0x148);
          uVar18 = N_VMaxNorm();
          *(undefined8 *)((long)kinmem + 0x250) = uVar18;
          KINPrintInfo(pKVar13,4,module_01,(char *)x,"scaled f norm (for stopping) = %12.3lg");
          KINPrintInfo(pKVar13,2,module_02,(char *)x,"nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
                       *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),
                       *(undefined8 *)((long)kinmem + 0xd8));
          lVar8 = *(long *)((long)kinmem + 0xd0);
          lVar1 = *(long *)((long)kinmem + 0x38);
          dVar21 = *(double *)((long)kinmem + 0x250);
          dVar23 = *(double *)((long)kinmem + 0x20);
          pKVar13 = *(KINMem *)((long)kinmem + 0x110);
          N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
          if (dVar21 <= dVar23 || lVar1 <= lVar8) {
            x = (N_Vector)0xfffffffa;
            if (lVar8 < lVar1) {
              x = (N_Vector)0xfffffc19;
            }
            pcVar14 = extraout_RDX_06;
            p_Var11 = (N_Vector)0x0;
            if (dVar23 < dVar21) {
              p_Var11 = x;
            }
LAB_0010bb9e:
            KINPrintInfo(pKVar13,1,pcVar14,(char *)x,"Return value: %d",p_Var11);
            return (int)p_Var11;
          }
          if (*(int *)((long)kinmem + 0x68) != 0) {
            sVar19 = (sunrealtype)
                     N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                *(undefined8 *)((long)kinmem + 0x130));
            KINForcingTerm((KINMem)kinmem,sVar19);
          }
        } while( true );
      }
      lVar8 = N_VClone(*(undefined8 *)((long)kinmem + 0x110));
      *(long *)((long)kinmem + 0x120) = lVar8;
      if (lVar8 != 0) {
        *(long *)((long)kinmem + 0x210) =
             *(long *)((long)kinmem + 0x210) + *(long *)((long)kinmem + 0x200);
        *(long *)((long)kinmem + 0x218) =
             *(long *)((long)kinmem + 0x218) + *(long *)((long)kinmem + 0x208);
        goto LAB_0010a40a;
      }
      pcVar14 = "A memory request failed.";
      iVar4 = -4;
      iVar12 = -4;
      iVar6 = 0x25d;
    }
  }
  goto LAB_00109efb;
  while( true ) {
    if (bVar16) {
      dVar22 = (local_f8 - dVar20) - local_e8 * dVar21;
      dVar20 = ((double)CONCAT44(uVar29,uVar28) - dVar20) - local_c8 * dVar21;
      dVar27 = 1.0 / (local_e8 - local_c8);
      dVar25 = ((1.0 / (local_e8 * local_e8)) * dVar22 + (-1.0 / (local_c8 * local_c8)) * dVar20) *
               dVar27;
      dVar27 = dVar27 * ((local_e8 / (local_c8 * local_c8)) * dVar20 -
                        (local_c8 / (local_e8 * local_e8)) * dVar22);
      dVar20 = dVar25 * 3.0;
      if (*(double *)((long)kinmem + 8) <= ABS(dVar25)) {
        dVar22 = dVar27 * dVar27 - dVar21 * dVar20;
        dVar25 = 0.0;
        if (0.0 < dVar22) {
          if (dVar22 < 0.0) {
            dVar25 = sqrt(dVar22);
          }
          else {
            dVar25 = SQRT(dVar22);
          }
        }
        dVar20 = (dVar25 - dVar27) / dVar20;
      }
      else {
        dVar20 = -dVar21 / (dVar27 + dVar27);
      }
    }
    else {
      dVar20 = (local_f8 - dVar20) - dVar21;
      dVar20 = -dVar21 / (dVar20 + dVar20);
    }
    dVar25 = local_e8 * 0.5;
    if (dVar20 <= local_e8 * 0.5) {
      dVar25 = dVar20;
    }
    dVar20 = local_e8 * 0.1;
    if (local_e8 * 0.1 <= dVar25) {
      dVar20 = dVar25;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar13 = *(KINMem *)((long)kinmem + 0x110);
    iVar6 = (**(code **)((long)kinmem + 0x10))
                      (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    bVar17 = false;
    pcVar9 = extraout_RDX_18;
    if (iVar6 != 0) goto LAB_0010b0a2;
    iVar4 = iVar4 + 1;
    pKVar13 = *(KINMem *)((long)kinmem + 0x118);
    local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
    dVar25 = local_f0 * 0.5 * local_f0;
    bVar16 = true;
    uVar28 = SUB84(local_f8,0);
    uVar29 = (undefined4)((ulong)local_f8 >> 0x20);
    pcVar9 = extraout_RDX_19;
    local_c8 = local_e8;
    local_e8 = dVar20;
    local_f8 = dVar25;
    if (dVar20 < dVar24) break;
LAB_0010adac:
    dVar25 = dVar23 * local_e8 + *(double *)((long)kinmem + 600);
    KINPrintInfo(pKVar13,9,pcVar9,pcVar14,
                 "fnorm = %15.8le   f1norm = %15.8le   alpha_cond = %15.8le  lam = %15.8le");
    dVar20 = *(double *)((long)kinmem + 600);
    if (local_f8 <= dVar25) {
      dVar21 = dVar21 * 0.9;
      pcVar9 = extraout_RDX_17;
      if (dVar21 * local_e8 + dVar20 <= local_f8) goto LAB_0010b827;
      if (((local_e8 != 1.0) || (NAN(local_e8))) || (*(double *)((long)kinmem + 0x78) <= local_100))
      goto LAB_0010b5b3;
      goto LAB_0010b391;
    }
  }
  pKVar13 = *(KINMem *)((long)kinmem + 0x108);
  N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x110));
  uVar15 = 0xfffffc1b;
  pcVar9 = extraout_RDX_20;
  goto LAB_0010b129;
  while( true ) {
    iVar4 = iVar4 + 1;
    pKVar13 = *(KINMem *)((long)kinmem + 0x118);
    local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
    local_f8 = local_f0 * 0.5 * local_f0;
    dVar22 = *(double *)((long)kinmem + 600);
    KINPrintInfo(pKVar13,10,module_08,pcVar14,
                 "f1norm = %15.8le   beta_cond = %15.8le   lam = %15.8le",local_f8);
    dVar25 = dVar23 * local_e8 + dVar22;
    pcVar9 = extraout_RDX_24;
    if (((local_98 <= dVar20) || (dVar25 < local_f8)) || (dVar21 * local_e8 + dVar22 <= local_f8))
    break;
LAB_0010b391:
    local_c8 = local_e8;
    dVar20 = local_c8 + local_c8;
    local_e8 = dVar20;
    if (local_98 <= dVar20) {
      local_e8 = local_98;
    }
    N_VLinearSum(*(undefined8 *)((long)kinmem + 0x108),*(undefined8 *)((long)kinmem + 0x138),
                 *(undefined8 *)((long)kinmem + 0x110));
    pKVar13 = *(KINMem *)((long)kinmem + 0x110);
    iVar6 = (**(code **)((long)kinmem + 0x10))
                      (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    if (iVar6 != 0) {
      uVar15 = 0xfffffff3;
      pcVar9 = extraout_RDX_23;
      goto LAB_0010b89a;
    }
  }
LAB_0010b5b3:
  if ((local_e8 < 1.0) || ((1.0 < local_e8 && (dVar25 < local_f8)))) {
    local_a8 = local_e8;
    if (local_c8 <= local_e8) {
      local_a8 = local_c8;
    }
    dVar20 = ABS(local_c8 - local_e8);
    do {
      iVar4 = iVar4 + 1;
      dVar25 = dVar20 * 0.5;
      local_e8 = local_a8 + dVar25;
      N_VLinearSum(*(undefined8 *)((long)kinmem + 0x108),*(undefined8 *)((long)kinmem + 0x138),
                   *(undefined8 *)((long)kinmem + 0x110));
      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
      iVar6 = (**(code **)((long)kinmem + 0x10))
                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      uVar15 = 0xfffffff3;
      bVar17 = false;
      pcVar9 = extraout_RDX_25;
      if (iVar6 != 0) goto LAB_0010b129;
      pKVar13 = *(KINMem *)((long)kinmem + 0x118);
      local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
      local_f8 = local_f0 * 0.5 * local_f0;
      dVar27 = dVar23 * local_e8 + *(double *)((long)kinmem + 600);
      dVar26 = dVar21 * local_e8 + *(double *)((long)kinmem + 600);
      KINPrintInfo(pKVar13,0xb,module_09,pcVar14,
                   "f1norm = %15.8le  alpha_cond = %15.8le  beta_cond = %15.8le  lam = %15.8le",
                   local_f8,dVar27);
      dVar22 = dVar25;
      if ((local_f8 <= dVar27) && (dVar22 = dVar20, local_f8 < dVar26)) {
        dVar22 = dVar20 - dVar25;
        local_a8 = local_e8;
      }
      dVar20 = dVar22;
    } while ((dVar27 < local_f8) || ((local_f8 < dVar26 && (dVar24 <= dVar22))));
    pcVar9 = extraout_RDX_26;
    if (local_f8 < dVar26) {
      N_VLinearSum(0x3ff0000000000000,local_a8,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar13 = *(KINMem *)((long)kinmem + 0x110);
      iVar6 = (**(code **)((long)kinmem + 0x10))
                        (pKVar13,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar9 = extraout_RDX_27;
      if (iVar6 != 0) goto LAB_0010b129;
      pKVar13 = *(KINMem *)((long)kinmem + 0x118);
      local_f0 = (double)N_VWL2Norm(pKVar13,*(undefined8 *)((long)kinmem + 0x130));
      local_f8 = local_f0 * 0.5 * local_f0;
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar9 = extraout_RDX_28;
    }
  }
LAB_0010b827:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar4;
  uVar15 = 0;
  KINPrintInfo(pKVar13,0xc,pcVar9,pcVar14,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x260) = local_d8 * local_e8 * *(double *)((long)kinmem + 0x260);
  *(double *)((long)kinmem + 0x268) = local_d8 * local_e8 * *(double *)((long)kinmem + 0x268);
  pcVar9 = extraout_RDX_29;
  if (local_100 * local_e8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b89a:
    bVar17 = false;
  }
  else {
    bVar17 = true;
  }
LAB_0010b129:
  uVar7 = (uint)uVar15;
  if ((uVar7 & 0xfffffff9) == 0xfffffff1) goto LAB_0010b9dc;
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    uVar15 = 0xfffffff8;
    goto LAB_0010b9dc;
  }
LAB_0010b162:
  uVar5 = 0;
LAB_0010b165:
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010b96a;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_f0);
  }
  *(double *)((long)kinmem + 0x250) = local_f0;
  if (uVar7 == 0xfffffc1b) {
    if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0)) {
      uVar5 = 0xfffffffb;
      if (*(int *)((long)kinmem + 0x30) == 0) {
        uVar5 = 2;
      }
    }
    else {
      *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
      uVar5 = 0xfffffc1a;
    }
  }
  else {
    N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
            *(undefined8 *)((long)kinmem + 0x148));
    pKVar13 = *(KINMem *)((long)kinmem + 0x148);
    dVar21 = (double)N_VMaxNorm();
    KINPrintInfo(pKVar13,4,module_07,pcVar14,"scaled f norm (for stopping) = %12.3lg");
    uVar5 = 0;
    if (*(double *)((long)kinmem + 0x20) < dVar21) {
      p_Var10 = *(N_Vector *)((long)kinmem + 0x138);
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                   *(undefined8 *)((long)kinmem + 0x108),p_Var10);
      sVar19 = KINScSNorm((KINMem)kinmem,p_Var10,*(N_Vector *)((long)kinmem + 0x110));
      if (sVar19 <= *(double *)((long)kinmem + 0x28)) {
        uVar5 = 2;
        if ((*(long *)((long)kinmem + 0x228) == 0) || (*(int *)((long)kinmem + 100) != 0))
        goto LAB_0010b2fd;
        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
      }
      else {
        lVar8 = *(long *)((long)kinmem + 0xd0);
        uVar5 = 0xfffffffa;
        if (*(long *)((long)kinmem + 0x38) <= lVar8) goto LAB_0010b2fd;
        if (bVar17) {
          pcVar14 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
        }
        else {
          pcVar14 = (char *)0x0;
        }
        *(char **)((long)kinmem + 0x100) = pcVar14;
        uVar5 = 0xfffffff9;
        if (pcVar14 == (char *)0x5) goto LAB_0010b2fd;
        if (*(int *)((long)kinmem + 0x240) == 0) {
          uVar5 = 0xfffffc19;
          if (*(int *)((long)kinmem + 0x6c) == 0) {
            pcVar14 = (char *)(lVar8 - *(long *)((long)kinmem + 0xe8));
            if ((long)pcVar14 < *(long *)((long)kinmem + 0x48)) {
              if ((*(int *)((long)kinmem + 0x70) != 0) || (*(int *)((long)kinmem + 0x74) != 0)) {
                *(undefined8 *)((long)kinmem + 0x270) = *(undefined8 *)((long)kinmem + 0x250);
              }
              if (*(int *)((long)kinmem + 0x74) != 0) {
                *(undefined4 *)((long)kinmem + 0x74) = 0;
              }
            }
            else {
              *(long *)((long)kinmem + 0xe8) = lVar8;
              if (*(int *)((long)kinmem + 0x278) != 0) {
                dVar23 = *(double *)((long)kinmem + 0x250) / *(double *)((long)kinmem + 0x20) + -1.0
                ;
                dVar21 = 0.0;
                if (0.0 <= dVar23) {
                  dVar21 = dVar23;
                }
                if (dVar21 <= 12.0) {
                  dVar24 = *(double *)((long)kinmem + 0x288);
                  dVar20 = exp(dVar21);
                  dVar23 = *(double *)((long)kinmem + 0x290);
                  if (dVar20 * dVar24 < dVar23) {
                    dVar24 = *(double *)((long)kinmem + 0x288);
                    dVar23 = exp(dVar21);
                    dVar23 = dVar23 * dVar24;
                  }
                }
                else {
                  dVar23 = *(double *)((long)kinmem + 0x290);
                }
                *(double *)((long)kinmem + 0x280) = dVar23;
              }
              if (*(double *)((long)kinmem + 0x280) * *(double *)((long)kinmem + 0x270) <
                  *(double *)((long)kinmem + 0x250)) {
                if ((*(long *)((long)kinmem + 0x228) != 0) && (*(int *)((long)kinmem + 100) == 0)) {
                  *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                }
                goto LAB_0010b2fd;
              }
              *(double *)((long)kinmem + 0x270) = *(double *)((long)kinmem + 0x250);
            }
            *(undefined8 *)((long)kinmem + 200) = 0x3ff0000000000000;
          }
          goto LAB_0010b2fd;
        }
        *(sunrealtype *)((long)kinmem + 200) = sVar19;
      }
      uVar5 = 0xfffffc19;
    }
  }
LAB_0010b2fd:
  if (uVar5 != 0xfffffc1a) goto LAB_0010b96a;
  *(undefined4 *)((long)kinmem + 0x70) = 1;
  uVar5 = 0xfffffc1a;
  goto LAB_0010a834;
LAB_0010b0a2:
  bVar17 = false;
  uVar15 = 0xfffffff3;
  goto LAB_0010b129;
LAB_0010b96a:
  uVar15 = (ulong)uVar5;
  pKVar13 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar13,*(undefined8 *)((long)kinmem + 0x108));
  *(double *)((long)kinmem + 600) = local_f8;
  KINPrintInfo(pKVar13,2,module_10,pcVar14,"nni = %4ld   nfe = %6ld   fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x250),*(undefined8 *)((long)kinmem + 0xd0),
               *(undefined8 *)((long)kinmem + 0xd8));
  bVar16 = uVar5 != 0xfffffc19;
  pcVar9 = extraout_RDX_30;
  uVar5 = 0xfffffc19;
  if (bVar16) goto LAB_0010b9dc;
  goto LAB_0010a7dd;
LAB_0010b9dc:
  KINPrintInfo(pKVar13,1,pcVar9,pcVar14,"Return value: %d",uVar15);
  iVar4 = (int)uVar15;
  switch(iVar4) {
  case -0xf:
    pcVar14 = "Unable to correct repeated recoverable system function errors.";
    iVar12 = -0xf;
    iVar6 = 0x2db;
    break;
  default:
    goto switchD_0010ba0c_caseD_fffffff2;
  case -0xd:
    pcVar14 = "The system function failed in an unrecoverable manner.";
    iVar12 = -0xd;
    iVar6 = 0x2d7;
    break;
  case -0xc:
    pcVar14 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    iVar12 = -0xc;
    iVar6 = 0x2e3;
    break;
  case -0xb:
    pcVar14 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    iVar12 = -0xb;
    iVar6 = 0x2df;
    break;
  case -9:
    pcVar14 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    iVar12 = -9;
    iVar6 = 0x2e7;
    break;
  case -8:
    pcVar14 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    iVar12 = -8;
    iVar6 = 0x2ef;
    break;
  case -7:
    pcVar14 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    iVar12 = -7;
    iVar6 = 0x2f7;
    break;
  case -6:
    pcVar14 = "The maximum number of iterations was reached before convergence.";
    iVar12 = -6;
    iVar6 = 0x2f3;
    break;
  case -5:
    pcVar14 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    iVar12 = -5;
    iVar6 = 0x2eb;
  }
LAB_00109efb:
  KINProcessError((KINMem)kinmem,iVar12,iVar6,"KINSol",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar14);
switchD_0010ba0c_caseD_fffffff2:
  return iVar4;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* intialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", "KINSol", INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", "KINSol", INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", "KINSol", INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}